

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightcollection.cpp
# Opt level: O1

Light * newLight(Json *conf)

{
  bool bVar1;
  const_reference pvVar2;
  Light *pLVar3;
  Image *this;
  undefined8 *puVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  vec3f vVar9;
  vec3f vVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"type");
  bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar2,"point");
  if (bVar1) {
    pLVar3 = (Light *)operator_new(0x28);
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"intensity");
    vVar9 = json2vec3f(pvVar2);
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"position");
    vVar10 = json2vec3f(pvVar2);
    fVar8 = vVar10.z;
    pLVar3->samplable = true;
    pLVar3->_vptr_Light = (_func_int **)&PTR_sampleIrradiance_0016c170;
    *(long *)&pLVar3->field_0xc = vVar9._0_8_;
    *(float *)((long)&pLVar3[1]._vptr_Light + 4) = vVar9.z;
    *(long *)&pLVar3[1].samplable = vVar10._0_8_;
  }
  else {
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"type");
    bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar2,"directional");
    if (!bVar1) {
      pvVar2 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"type");
      bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar2,"constant");
      if (bVar1) {
        pLVar3 = (Light *)operator_new(0x18);
        pvVar2 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)conf,"radiance");
        vVar9 = json2vec3f(pvVar2);
        pLVar3->samplable = false;
        pLVar3->_vptr_Light = (_func_int **)&PTR_sampleIrradiance_0016c1f8;
        *(long *)&pLVar3->field_0xc = vVar9._0_8_;
        *(float *)((long)&pLVar3[1]._vptr_Light + 4) = vVar9.z;
        return pLVar3;
      }
      pvVar2 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"type");
      bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar2,"envmap");
      if (bVar1) {
        pLVar3 = (Light *)operator_new(0x18);
        this = (Image *)operator_new(0x10);
        pvVar2 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)conf,"radiance");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_58,pvVar2);
        getpath(&local_38,&local_58);
        Image::Image(this,&local_38);
        pLVar3->samplable = false;
        pLVar3->_vptr_Light = (_func_int **)&PTR_sampleIrradiance_0016c230;
        pLVar3[1]._vptr_Light = (_func_int **)this;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p == &local_58.field_2) {
          return pLVar3;
        }
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        return pLVar3;
      }
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "unrecognized type of light source";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
    pLVar3 = (Light *)operator_new(0x28);
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"irradiance");
    vVar9 = json2vec3f(pvVar2);
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"direction");
    vVar10 = json2vec3f(pvVar2);
    fVar8 = vVar10.z;
    fVar5 = vVar10.x;
    fVar7 = vVar10.y;
    pLVar3->samplable = true;
    pLVar3->_vptr_Light = (_func_int **)&PTR_sampleIrradiance_0016c1c0;
    *(long *)&pLVar3->field_0xc = vVar9._0_8_;
    *(float *)((long)&pLVar3[1]._vptr_Light + 4) = vVar9.z;
    fVar6 = fVar8 * fVar8 + fVar5 * fVar5 + fVar7 * fVar7;
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    fVar6 = 1.0 / fVar6;
    fVar8 = fVar8 * fVar6;
    *(ulong *)&pLVar3[1].samplable = CONCAT44(fVar6 * fVar7,fVar6 * fVar5);
  }
  *(float *)&pLVar3[2]._vptr_Light = fVar8;
  return pLVar3;
}

Assistant:

Light* newLight(const Json& conf) {
	if (conf["type"] == "point")
		return new PointLight(json2vec3f(conf["intensity"]), json2vec3f(conf["position"]));
	if (conf["type"] == "directional")
		return new DirectionalLight(json2vec3f(conf["irradiance"]), json2vec3f(conf["direction"]));
	if (conf["type"] == "constant")
		return new ConstEnvLight(json2vec3f(conf["radiance"]));
	if (conf["type"] == "envmap")
		return new EnvLight(new Image(getpath(conf["radiance"])));
	throw "unrecognized type of light source";
}